

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O3

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *
cfd::api::TransactionApiBase::CreateMultisigSignatureData
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          Script *redeem_script)

{
  pointer *ppuVar1;
  size_t __n;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  iterator __position;
  CfdException *this;
  pointer this_00;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  string pubkey_hex;
  Pubkey related_pubkey;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  SignParameter sign_param;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_148;
  undefined1 local_130 [32];
  string local_110;
  Pubkey local_f0;
  Script *local_d8;
  Pubkey *local_d0;
  Pubkey *local_c8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_c0;
  SignParameter local_a8;
  
  local_d8 = redeem_script;
  core::ScriptUtil::ExtractPubkeysFromMultisigScript(&local_c0,redeem_script,(uint32_t *)0x0);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector(&local_148,sign_list)
  ;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = local_c0.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_c0.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c0.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_c8 = local_c0.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      core::Pubkey::GetHex_abi_cxx11_
                (&local_110,
                 local_c0.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      __position._M_current =
           local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
      while (__position._M_current !=
             local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        SignParameter::SignParameter(&local_a8,__position._M_current);
        SignParameter::GetRelatedPubkey(&local_f0,&local_a8);
        bVar3 = core::Pubkey::IsValid(&local_f0);
        if (bVar3) {
          core::Pubkey::GetHex_abi_cxx11_((string *)local_130,&local_f0);
          uVar2 = local_130._0_8_;
          __n = CONCAT44(local_130._12_4_,local_130._8_4_);
          if (__n == local_110._M_string_length) {
            if (__n == 0) {
              bVar3 = false;
            }
            else {
              iVar4 = bcmp((void *)local_130._0_8_,local_110._M_dataplus._M_p,__n);
              bVar3 = iVar4 != 0;
            }
          }
          else {
            bVar3 = true;
          }
          if ((undefined1 *)uVar2 != local_130 + 0x10) {
            operator_delete((void *)uVar2);
          }
          if (bVar3) goto LAB_003b540e;
          __position = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
                       _M_erase(&local_148,__position);
          SignParameter::ConvertToSignature((ByteData *)local_130,&local_a8);
          std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
          emplace_back<cfd::core::ByteData>(__return_storage_ptr__,(ByteData *)local_130);
          if ((pointer)local_130._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_130._0_8_);
          }
        }
        else {
LAB_003b540e:
          __position._M_current = __position._M_current + 1;
        }
        if (local_f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_a8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00722da0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.op_code_.text_data_._M_dataplus._M_p !=
            &local_a8.op_code_.text_data_.field_2) {
          operator_delete(local_a8.op_code_.text_data_._M_dataplus._M_p);
        }
        if (local_a8.related_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.related_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      local_c0.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_start = local_c8 + 1;
    } while (local_c0.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_start != local_d0);
  }
  if (local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      SignParameter::GetRelatedPubkey((Pubkey *)&local_a8,this_00);
      bVar3 = core::Pubkey::IsValid((Pubkey *)&local_a8);
      if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (bVar3) {
        local_130._0_8_ = "cfdapi_transaction_base.cpp";
        local_130._8_4_ = 0x16d;
        local_130._16_8_ = "CreateMultisigSignatureData";
        SignParameter::GetRelatedPubkey(&local_f0,this_00);
        core::Pubkey::GetHex_abi_cxx11_((string *)&local_a8,&local_f0);
        core::Script::GetHex_abi_cxx11_(&local_110,local_d8);
        core::logger::log<std::__cxx11::string&,std::__cxx11::string_const&>
                  ((CfdSourceLocation *)local_130,kCfdLogLevelWarning,
                   "Failed to CreateMultisigSignatureData. Missing related pubkey in script.: relatedPubkey={}, script={}"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                   &local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        ppuVar1 = (pointer *)
                  ((long)&local_a8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
        if ((pointer *)
            local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != ppuVar1) {
          operator_delete(local_a8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        this = (CfdException *)__cxa_allocate_exception(0x30);
        local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,
                   "Missing related pubkey in script. Check your signature and pubkey pair.","");
        core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_a8);
        __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      SignParameter::ConvertToSignature(&local_a8.data_,this_00);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&local_a8.data_);
      if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_148);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData> TransactionApiBase::CreateMultisigSignatureData(
    const std::vector<SignParameter>& sign_list, const Script& redeem_script) {
  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);
  // get signParams from json request
  std::vector<SignParameter> sign_params = sign_list;

  // set signParam to signature_data (only contains relatedPubkey);
  std::vector<ByteData> signature_data;
  for (const Pubkey& pubkey : pubkeys) {
    std::string pubkey_hex = pubkey.GetHex();
    for (auto itr = sign_params.begin(); itr != sign_params.end();) {
      SignParameter sign_param = *itr;
      Pubkey related_pubkey = sign_param.GetRelatedPubkey();
      if ((!related_pubkey.IsValid()) ||
          (related_pubkey.GetHex() != pubkey_hex)) {
        ++itr;
        continue;
      }

      itr = sign_params.erase(itr);
      signature_data.push_back(sign_param.ConvertToSignature());
    }
  }

  // set the others to signature data
  for (const auto& sign_param : sign_params) {
    // related pubkey not found in script
    if (sign_param.GetRelatedPubkey().IsValid()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateMultisigSignatureData. Missing related pubkey"
          " in script.: relatedPubkey={}, script={}",
          sign_param.GetRelatedPubkey().GetHex(), redeem_script.GetHex());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Missing related pubkey in script."
          " Check your signature and pubkey pair.");
    }
    signature_data.push_back(sign_param.ConvertToSignature());
  }

  return signature_data;
}